

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O0

int testBatchedMatMulDynamicQuantizationConversionParameterValidation(void)

{
  bool bVar1;
  ModelDescription *pMVar2;
  FeatureType *pFVar3;
  QuantizationParams *pQVar4;
  LinearQuantizationParams *pLVar5;
  ostream *poVar6;
  LookUpTableQuantizationParams *this;
  Result local_1d8;
  undefined1 local_1a8 [4];
  int i;
  undefined1 local_158 [80];
  undefined1 local_108 [84];
  undefined4 local_b4;
  Result local_b0;
  WeightParams *weights;
  BatchedMatMulLayerParams *batch_mat_mul_params;
  NeuralNetworkLayer *layer1;
  FeatureDescription *out;
  ArrayFeatureType *shape;
  FeatureDescription *topIn;
  NeuralNetwork *local_48;
  NeuralNetwork *nnMain;
  Model m1;
  
  CoreML::Specification::Model::Model((Model *)&nnMain);
  local_48 = CoreML::Specification::Model::mutable_neuralnetwork((Model *)&nnMain);
  CoreML::Specification::NeuralNetwork::set_arrayinputshapemapping(local_48,EXACT_ARRAY_MAPPING);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)&nnMain);
  shape = (ArrayFeatureType *)CoreML::Specification::ModelDescription::add_input(pMVar2);
  CoreML::Specification::FeatureDescription::set_name((FeatureDescription *)shape,"A");
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type((FeatureDescription *)shape);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar3);
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type((FeatureDescription *)shape);
  out = (FeatureDescription *)CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar3);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)out,1);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)&nnMain);
  layer1 = (NeuralNetworkLayer *)CoreML::Specification::ModelDescription::add_output(pMVar2);
  CoreML::Specification::FeatureDescription::set_name((FeatureDescription *)layer1,"B");
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type((FeatureDescription *)layer1);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar3);
  batch_mat_mul_params =
       (BatchedMatMulLayerParams *)CoreML::Specification::NeuralNetwork::add_layers(local_48);
  CoreML::Specification::NeuralNetworkLayer::set_name
            ((NeuralNetworkLayer *)batch_mat_mul_params,"batched_mat_mul");
  CoreML::Specification::NeuralNetworkLayer::add_input
            ((NeuralNetworkLayer *)batch_mat_mul_params,"A");
  CoreML::Specification::NeuralNetworkLayer::add_output
            ((NeuralNetworkLayer *)batch_mat_mul_params,"B");
  weights = (WeightParams *)
            CoreML::Specification::NeuralNetworkLayer::mutable_batchedmatmul
                      ((NeuralNetworkLayer *)batch_mat_mul_params);
  CoreML::Specification::BatchedMatMulLayerParams::set_weightmatrixfirstdimension
            ((BatchedMatMulLayerParams *)weights,4);
  CoreML::Specification::BatchedMatMulLayerParams::set_weightmatrixseconddimension
            ((BatchedMatMulLayerParams *)weights,2);
  CoreML::Specification::BatchedMatMulLayerParams::set_hasbias
            ((BatchedMatMulLayerParams *)weights,false);
  CoreML::Specification::BatchedMatMulLayerParams::set_int8dynamicquantize
            ((BatchedMatMulLayerParams *)weights,true);
  local_b0.m_message._M_storage._M_storage =
       (uchar  [8])
       CoreML::Specification::BatchedMatMulLayerParams::mutable_weights
                 ((BatchedMatMulLayerParams *)weights);
  CoreML::Specification::WeightParams::set_int8rawvalue
            ((WeightParams *)local_b0.m_message._M_storage._M_storage,"11111111");
  pQVar4 = CoreML::Specification::WeightParams::mutable_quantization
                     ((WeightParams *)local_b0.m_message._M_storage._M_storage);
  CoreML::Specification::QuantizationParams::set_numberofbits(pQVar4,8);
  pQVar4 = CoreML::Specification::WeightParams::mutable_quantization
                     ((WeightParams *)local_b0.m_message._M_storage._M_storage);
  pLVar5 = CoreML::Specification::QuantizationParams::mutable_linearquantization(pQVar4);
  CoreML::Specification::LinearQuantizationParams::add_scale(pLVar5,4.0);
  CoreML::validate<(MLModelType)500>(&local_b0,(Model *)&nnMain);
  bVar1 = CoreML::Result::good(&local_b0);
  if (bVar1) {
    CoreML::Specification::BatchedMatMulLayerParams::set_hasbias
              ((BatchedMatMulLayerParams *)weights,true);
    CoreML::validate<(MLModelType)500>((Result *)(local_108 + 0x28),(Model *)&nnMain);
    CoreML::Result::operator=(&local_b0,(Result *)(local_108 + 0x28));
    CoreML::Result::~Result((Result *)(local_108 + 0x28));
    bVar1 = CoreML::Result::good(&local_b0);
    if (bVar1) {
      CoreML::Specification::BatchedMatMulLayerParams::set_hasbias
                ((BatchedMatMulLayerParams *)weights,false);
      pQVar4 = CoreML::Specification::WeightParams::mutable_quantization
                         ((WeightParams *)local_b0.m_message._M_storage._M_storage);
      pLVar5 = CoreML::Specification::QuantizationParams::mutable_linearquantization(pQVar4);
      CoreML::Specification::LinearQuantizationParams::add_bias(pLVar5,0.0);
      CoreML::validate<(MLModelType)500>((Result *)local_108,(Model *)&nnMain);
      CoreML::Result::operator=(&local_b0,(Result *)local_108);
      CoreML::Result::~Result((Result *)local_108);
      bVar1 = CoreML::Result::good(&local_b0);
      if (bVar1) {
        poVar6 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                );
        poVar6 = std::operator<<(poVar6,":");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x2d7);
        poVar6 = std::operator<<(poVar6,": error: ");
        poVar6 = std::operator<<(poVar6,"!((res).good())");
        poVar6 = std::operator<<(poVar6," was false, expected true.");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        m1._oneof_case_[0] = 1;
      }
      else {
        pQVar4 = CoreML::Specification::WeightParams::mutable_quantization
                           ((WeightParams *)local_b0.m_message._M_storage._M_storage);
        pLVar5 = CoreML::Specification::QuantizationParams::mutable_linearquantization(pQVar4);
        CoreML::Specification::LinearQuantizationParams::clear_bias(pLVar5);
        pQVar4 = CoreML::Specification::WeightParams::mutable_quantization
                           ((WeightParams *)local_b0.m_message._M_storage._M_storage);
        CoreML::Specification::QuantizationParams::set_numberofbits(pQVar4,7);
        CoreML::validate<(MLModelType)500>((Result *)(local_158 + 0x28),(Model *)&nnMain);
        CoreML::Result::operator=(&local_b0,(Result *)(local_158 + 0x28));
        CoreML::Result::~Result((Result *)(local_158 + 0x28));
        bVar1 = CoreML::Result::good(&local_b0);
        if (bVar1) {
          poVar6 = std::operator<<((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                  );
          poVar6 = std::operator<<(poVar6,":");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x2dd);
          poVar6 = std::operator<<(poVar6,": error: ");
          poVar6 = std::operator<<(poVar6,"!((res).good())");
          poVar6 = std::operator<<(poVar6," was false, expected true.");
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          m1._oneof_case_[0] = 1;
        }
        else {
          pQVar4 = CoreML::Specification::WeightParams::mutable_quantization
                             ((WeightParams *)local_b0.m_message._M_storage._M_storage);
          CoreML::Specification::QuantizationParams::set_numberofbits(pQVar4,8);
          pQVar4 = CoreML::Specification::WeightParams::mutable_quantization
                             ((WeightParams *)local_b0.m_message._M_storage._M_storage);
          this = CoreML::Specification::QuantizationParams::mutable_lookuptablequantization(pQVar4);
          CoreML::Specification::LookUpTableQuantizationParams::add_floatvalue(this,1.0);
          CoreML::validate<(MLModelType)500>((Result *)local_158,(Model *)&nnMain);
          CoreML::Result::operator=(&local_b0,(Result *)local_158);
          CoreML::Result::~Result((Result *)local_158);
          bVar1 = CoreML::Result::good(&local_b0);
          if (bVar1) {
            poVar6 = std::operator<<((ostream *)&std::cout,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                    );
            poVar6 = std::operator<<(poVar6,":");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x2e3);
            poVar6 = std::operator<<(poVar6,": error: ");
            poVar6 = std::operator<<(poVar6,"!((res).good())");
            poVar6 = std::operator<<(poVar6," was false, expected true.");
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            m1._oneof_case_[0] = 1;
          }
          else {
            pQVar4 = CoreML::Specification::WeightParams::mutable_quantization
                               ((WeightParams *)local_b0.m_message._M_storage._M_storage);
            pLVar5 = CoreML::Specification::QuantizationParams::mutable_linearquantization(pQVar4);
            CoreML::Specification::LinearQuantizationParams::add_scale(pLVar5,4.0);
            CoreML::Specification::WeightParams::clear_int8rawvalue
                      ((WeightParams *)local_b0.m_message._M_storage._M_storage);
            CoreML::Specification::WeightParams::set_rawvalue
                      ((WeightParams *)local_b0.m_message._M_storage._M_storage,"11111111");
            CoreML::validate<(MLModelType)500>((Result *)&stack0xfffffffffffffe80,(Model *)&nnMain);
            CoreML::Result::operator=(&local_b0,(Result *)&stack0xfffffffffffffe80);
            CoreML::Result::~Result((Result *)&stack0xfffffffffffffe80);
            bVar1 = CoreML::Result::good(&local_b0);
            if (bVar1) {
              poVar6 = std::operator<<((ostream *)&std::cout,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                      );
              poVar6 = std::operator<<(poVar6,":");
              poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x2ea);
              poVar6 = std::operator<<(poVar6,": error: ");
              poVar6 = std::operator<<(poVar6,"!((res).good())");
              poVar6 = std::operator<<(poVar6," was false, expected true.");
              std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
              m1._oneof_case_[0] = 1;
            }
            else {
              CoreML::Specification::WeightParams::clear_rawvalue
                        ((WeightParams *)local_b0.m_message._M_storage._M_storage);
              CoreML::Specification::WeightParams::set_float16value
                        ((WeightParams *)local_b0.m_message._M_storage._M_storage,"0101010101010101"
                        );
              CoreML::validate<(MLModelType)500>((Result *)local_1a8,(Model *)&nnMain);
              CoreML::Result::operator=(&local_b0,(Result *)local_1a8);
              CoreML::Result::~Result((Result *)local_1a8);
              bVar1 = CoreML::Result::good(&local_b0);
              if (bVar1) {
                poVar6 = std::operator<<((ostream *)&std::cout,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                        );
                poVar6 = std::operator<<(poVar6,":");
                poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x2f0);
                poVar6 = std::operator<<(poVar6,": error: ");
                poVar6 = std::operator<<(poVar6,"!((res).good())");
                poVar6 = std::operator<<(poVar6," was false, expected true.");
                std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                m1._oneof_case_[0] = 1;
              }
              else {
                CoreML::Specification::WeightParams::clear_float16value
                          ((WeightParams *)local_b0.m_message._M_storage._M_storage);
                local_1d8.m_message._M_storage._M_storage[4] = '\0';
                local_1d8.m_message._M_storage._M_storage[5] = '\0';
                local_1d8.m_message._M_storage._M_storage[6] = '\0';
                local_1d8.m_message._M_storage._M_storage[7] = '\0';
                for (; (int)local_1d8.m_message._M_storage._M_storage._4_4_ < 8;
                    local_1d8.m_message._M_storage._M_storage._4_4_ =
                         local_1d8.m_message._M_storage._M_storage._4_4_ + 1) {
                  CoreML::Specification::WeightParams::add_floatvalue
                            ((WeightParams *)local_b0.m_message._M_storage._M_storage,1.0);
                }
                CoreML::validate<(MLModelType)500>(&local_1d8,(Model *)&nnMain);
                CoreML::Result::operator=(&local_b0,&local_1d8);
                CoreML::Result::~Result(&local_1d8);
                bVar1 = CoreML::Result::good(&local_b0);
                if (bVar1) {
                  poVar6 = std::operator<<((ostream *)&std::cout,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                          );
                  poVar6 = std::operator<<(poVar6,":");
                  poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x2f8);
                  poVar6 = std::operator<<(poVar6,": error: ");
                  poVar6 = std::operator<<(poVar6,"!((res).good())");
                  poVar6 = std::operator<<(poVar6," was false, expected true.");
                  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                  m1._oneof_case_[0] = 1;
                }
                else {
                  CoreML::Specification::WeightParams::clear_floatvalue
                            ((WeightParams *)local_b0.m_message._M_storage._M_storage);
                  m1._oneof_case_[0] = 0;
                }
              }
            }
          }
        }
      }
    }
    else {
      poVar6 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                              );
      poVar6 = std::operator<<(poVar6,":");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x2d1);
      poVar6 = std::operator<<(poVar6,": error: ");
      poVar6 = std::operator<<(poVar6,"(res).good()");
      poVar6 = std::operator<<(poVar6," was false, expected true.");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      m1._oneof_case_[0] = 1;
    }
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x2cc);
    poVar6 = std::operator<<(poVar6,": error: ");
    poVar6 = std::operator<<(poVar6,"(res).good()");
    poVar6 = std::operator<<(poVar6," was false, expected true.");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    m1._oneof_case_[0] = 1;
  }
  local_b4 = 1;
  CoreML::Result::~Result(&local_b0);
  CoreML::Specification::Model::~Model((Model *)&nnMain);
  return m1._oneof_case_[0];
}

Assistant:

int testBatchedMatMulDynamicQuantizationConversionParameterValidation() {

    Specification::Model m1;
    Specification::NeuralNetwork* nnMain = m1.mutable_neuralnetwork();
    // Required for spec v4 and onwards
    nnMain->set_arrayinputshapemapping(Specification::EXACT_ARRAY_MAPPING);

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("A");
    topIn->mutable_type()->mutable_multiarraytype();
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);

    auto *out = m1.mutable_description()->add_output();
    out->set_name("B");
    out->mutable_type()->mutable_multiarraytype();

    Specification::NeuralNetworkLayer* layer1 = nnMain->add_layers();
    layer1->set_name("batched_mat_mul");
    layer1->add_input("A");
    layer1->add_output("B");
    Specification::BatchedMatMulLayerParams* batch_mat_mul_params = layer1->mutable_batchedmatmul();
    batch_mat_mul_params->set_weightmatrixfirstdimension(4);
    batch_mat_mul_params->set_weightmatrixseconddimension(2);
    batch_mat_mul_params->set_hasbias(false);
    batch_mat_mul_params->set_int8dynamicquantize(true);

    auto* weights = batch_mat_mul_params->mutable_weights();
    weights->set_int8rawvalue("11111111");
    weights->mutable_quantization()->set_numberofbits(8);
    weights->mutable_quantization()->mutable_linearquantization()->add_scale(4);

    // Setup: Correct validation
    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_GOOD(res);

    // Case 1: has bias
    batch_mat_mul_params->set_hasbias(true);
    res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_GOOD(res);
    batch_mat_mul_params->set_hasbias(false);

    // Case 2: Non empty linear quantization bias
    weights->mutable_quantization()->mutable_linearquantization()->add_bias(0);
    res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    weights->mutable_quantization()->mutable_linearquantization()->clear_bias();

    // Case 3: numberofbits != 8
    weights->mutable_quantization()->set_numberofbits(7);
    res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    weights->mutable_quantization()->set_numberofbits(8);

    // Case 4: Lookup table mode is on
    weights->mutable_quantization()->mutable_lookuptablequantization()->add_floatvalue(1);
    res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    weights->mutable_quantization()->mutable_linearquantization()->add_scale(4);

    // Case 5: uint8 weights
    weights->clear_int8rawvalue();
    weights->set_rawvalue("11111111");
    res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    weights->clear_rawvalue();

    // Case 6: float16 weights
    weights->set_float16value("0101010101010101");
    res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    weights->clear_float16value();

    // Case 7: float weights
    for (int i = 0; i < 8; ++i){
        weights->add_floatvalue(1);
    }
    res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    weights->clear_floatvalue();

    return 0;
}